

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

UBool icu_63::matches16CPB(UChar *s,int32_t start,int32_t limit,UChar *t,int32_t length)

{
  UBool UVar1;
  UChar *s_00;
  bool local_26;
  byte local_25;
  int32_t length_local;
  UChar *t_local;
  int32_t limit_local;
  int32_t start_local;
  UChar *s_local;
  
  s_00 = s + start;
  UVar1 = matches16(s_00,t,length);
  local_25 = 0;
  if ((UVar1 != '\0') &&
     (((start < 1 || ((s_00[-1] & 0xfc00U) != 0xd800)) ||
      (local_25 = 0, (*s_00 & 0xfc00U) != 0xdc00)))) {
    local_26 = false;
    if ((length < limit - start) && (local_26 = false, (s_00[length + -1] & 0xfc00U) == 0xd800)) {
      local_26 = (s_00[length] & 0xfc00U) == 0xdc00;
    }
    local_25 = local_26 ^ 0xff;
  }
  return local_25 & 1;
}

Assistant:

static inline UBool
matches16CPB(const UChar *s, int32_t start, int32_t limit, const UChar *t, int32_t length) {
    s+=start;
    limit-=start;
    return matches16(s, t, length) &&
           !(0<start && U16_IS_LEAD(s[-1]) && U16_IS_TRAIL(s[0])) &&
           !(length<limit && U16_IS_LEAD(s[length-1]) && U16_IS_TRAIL(s[length]));
}